

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<IfStatementAstNode>_> * __thiscall
Parser::parseIfStatement
          (optional<std::shared_ptr<IfStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<ExpressionAstNode> *psVar4;
  shared_ptr<StatementAstNode> *__args_2;
  TokenType type;
  byte local_249;
  byte local_229;
  shared_ptr<ExpressionAstNode> local_1b0;
  shared_ptr<ExpressionAstNode> local_198;
  undefined4 local_188;
  optional<std::shared_ptr<StatementAstNode>_> local_180;
  allocator<char> local_161;
  string local_160 [32];
  undefined1 local_140 [16];
  undefined1 local_130 [24];
  undefined1 local_118 [8];
  optional<std::shared_ptr<StatementAstNode>_> elseStatement;
  undefined1 local_f8 [7];
  bool foundElse;
  optional<std::shared_ptr<StatementAstNode>_> ifStatement;
  string local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  string local_88 [32];
  undefined1 local_68 [24];
  string local_50 [32];
  undefined1 local_30 [23];
  undefined1 local_19 [8];
  bool error;
  Parser *this_local;
  
  local_19[0] = (_Alloc_hider)0x0;
  unique0x100006ff = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Expected an if",(allocator<char> *)(local_68 + 0x17));
  type = (TokenType)this;
  expect((Parser *)local_30,type,(bool *)0xd,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)(local_68 + 0x17));
  skipWhiteSpace(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"Expected a left paren after if",
             (allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  expect((Parser *)local_68,type,(bool *)0x5,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"Expected a right paren after expression of if",
             (allocator<char> *)
             &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.field_0x17);
  expect((Parser *)local_b8,type,(bool *)0x6,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.field_0x17);
  parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)local_f8,this);
  elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._23_1_ = 0;
  std::optional<std::shared_ptr<StatementAstNode>_>::optional
            ((optional<std::shared_ptr<StatementAstNode>_> *)local_118);
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  TokenBuffer::currentToken((TokenBuffer *)local_130);
  peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_130);
  TVar1 = peVar3->tokenType;
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_130);
  if (TVar1 == Else) {
    elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._23_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_160,"Expected an else",&local_161);
    expect((Parser *)local_140,type,(bool *)0xe,(string *)local_19);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_140);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
    parseStatement(&local_180,this);
    std::optional<std::shared_ptr<StatementAstNode>_>::operator=
              ((optional<std::shared_ptr<StatementAstNode>_> *)local_118,&local_180);
    std::optional<std::shared_ptr<StatementAstNode>_>::~optional(&local_180);
  }
  if ((elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
       _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._23_1_ & 1) == 0) {
    local_249 = 1;
    if (((byte)local_19[0] & 1) == 0) {
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_a8);
      local_249 = 1;
      if (bVar2) {
        bVar2 = std::optional::operator_cast_to_bool((optional *)local_f8);
        local_249 = bVar2 ^ 0xff;
      }
    }
    local_19[0] = (_Alloc_hider)(local_249 & 1);
    if (local_19[0] == (_Alloc_hider)0x0) {
      psVar4 = std::optional<std::shared_ptr<ExpressionAstNode>_>::value
                         ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8);
      std::optional<std::shared_ptr<StatementAstNode>_>::value
                ((optional<std::shared_ptr<StatementAstNode>_> *)local_f8);
      std::
      make_shared<IfStatementAstNode,std::shared_ptr<ExpressionAstNode>&,std::shared_ptr<StatementAstNode>&>
                (&local_1b0,(shared_ptr<StatementAstNode> *)psVar4);
      std::optional<std::shared_ptr<IfStatementAstNode>_>::
      optional<std::shared_ptr<IfStatementAstNode>,_true>
                (__return_storage_ptr__,(shared_ptr<IfStatementAstNode> *)&local_1b0);
      std::shared_ptr<IfStatementAstNode>::~shared_ptr((shared_ptr<IfStatementAstNode> *)&local_1b0)
      ;
    }
    else {
      std::optional<std::shared_ptr<IfStatementAstNode>_>::optional(__return_storage_ptr__);
    }
  }
  else {
    local_229 = 1;
    if (((byte)local_19[0] & 1) == 0) {
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_a8);
      local_229 = 1;
      if (bVar2) {
        bVar2 = std::optional::operator_cast_to_bool((optional *)local_f8);
        local_229 = 1;
        if (bVar2) {
          bVar2 = std::optional::operator_cast_to_bool((optional *)local_118);
          local_229 = bVar2 ^ 0xff;
        }
      }
    }
    local_19[0] = (_Alloc_hider)(local_229 & 1);
    if (local_19[0] == (_Alloc_hider)0x0) {
      psVar4 = std::optional<std::shared_ptr<ExpressionAstNode>_>::value
                         ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8);
      __args_2 = std::optional<std::shared_ptr<StatementAstNode>_>::value
                           ((optional<std::shared_ptr<StatementAstNode>_> *)local_f8);
      std::optional<std::shared_ptr<StatementAstNode>_>::value
                ((optional<std::shared_ptr<StatementAstNode>_> *)local_118);
      std::
      make_shared<IfStatementAstNode,std::shared_ptr<ExpressionAstNode>&,std::shared_ptr<StatementAstNode>&,std::shared_ptr<StatementAstNode>&>
                (&local_198,(shared_ptr<StatementAstNode> *)psVar4,__args_2);
      std::optional<std::shared_ptr<IfStatementAstNode>_>::
      optional<std::shared_ptr<IfStatementAstNode>,_true>
                (__return_storage_ptr__,(shared_ptr<IfStatementAstNode> *)&local_198);
      std::shared_ptr<IfStatementAstNode>::~shared_ptr((shared_ptr<IfStatementAstNode> *)&local_198)
      ;
    }
    else {
      std::optional<std::shared_ptr<IfStatementAstNode>_>::optional(__return_storage_ptr__);
    }
  }
  local_188 = 1;
  std::optional<std::shared_ptr<StatementAstNode>_>::~optional
            ((optional<std::shared_ptr<StatementAstNode>_> *)local_118);
  std::optional<std::shared_ptr<StatementAstNode>_>::~optional
            ((optional<std::shared_ptr<StatementAstNode>_> *)local_f8);
  std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional
            ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<IfStatementAstNode>>
Parser::parseIfStatement() noexcept {
  bool error = false;

  this->expect(TokenType::If, error, "Expected an if");

  this->skipWhiteSpace();

  this->expect(TokenType::LeftParen, error, "Expected a left paren after if");

  auto expression = this->parseExpression();

  this->expect(TokenType::RightParen, error, "Expected a right paren after expression of if");

  auto ifStatement = this->parseStatement();

  bool foundElse = false;
  std::optional<std::shared_ptr<StatementAstNode>> elseStatement{std::nullopt};

  if (this->tokenBuffer->currentToken()->tokenType == TokenType::Else) {
    foundElse = true;
    this->expect(TokenType::Else, error, "Expected an else");

    elseStatement = this->parseStatement();
  }

  if (foundElse) {
    error = error || !expression || !ifStatement || !elseStatement;

    if (error) { return std::nullopt; }

    return std::make_shared<IfStatementAstNode>(
      expression.value(), ifStatement.value(), elseStatement.value());
  }

  // else, we did not find an else

  error = error || !expression || !ifStatement;

  if (error) { return std::nullopt; }

  return std::make_shared<IfStatementAstNode>(expression.value(), ifStatement.value());
}